

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  HasBits<1> *pHVar1;
  ushort *puVar2;
  FeatureSet *from;
  OneofOptions *pOVar3;
  OneofOptions *pOVar4;
  FeatureSet *pFVar5;
  Arena *pAVar6;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar2 + ~value._M_len);
  pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar6);
  pOVar4 = this->options_;
  if (pOVar4 != (OneofOptions *)_OneofOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (OneofOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pOVar3 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pOVar3;
    }
    OneofOptions::CopyFrom((proto->field_0)._impl_.options_,pOVar4);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    if ((proto->field_0)._impl_.options_ == (OneofOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pOVar4 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pOVar4;
    }
    pOVar4 = (proto->field_0)._impl_.options_;
    pHVar1 = &(pOVar4->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
    if ((pOVar4->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      pAVar6 = (Arena *)(pOVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pFVar5 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar6);
      (pOVar4->field_0)._impl_.features_ = pFVar5;
    }
    FeatureSet::CopyFrom((pOVar4->field_0)._impl_.features_,from);
    return;
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}